

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QByteArray,_QByteArray>_>::insert
          (QMovableArrayOps<std::pair<QByteArray,_QByteArray>_> *this,qsizetype i,qsizetype n,
          parameter_type t)

{
  qsizetype *pqVar1;
  QArrayData *pQVar2;
  char *pcVar3;
  qsizetype qVar4;
  QArrayData *pQVar5;
  char *pcVar6;
  qsizetype qVar7;
  pair<QByteArray,_QByteArray> *ppVar8;
  long lVar9;
  qsizetype inserts;
  bool bVar10;
  
  pQVar2 = &((t->first).d.d)->super_QArrayData;
  pcVar3 = (t->first).d.ptr;
  qVar4 = (t->first).d.size;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pQVar5 = &((t->second).d.d)->super_QArrayData;
  pcVar6 = (t->second).d.ptr;
  qVar7 = (t->second).d.size;
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar10 = (this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
           super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.size != 0;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)this,(uint)(i == 0 && bVar10),
             n,(pair<QByteArray,_QByteArray> **)0x0,
             (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x0);
  if (i == 0 && bVar10) {
    if (n != 0) {
      ppVar8 = (this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
               super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.ptr;
      do {
        ppVar8[-1].first.d.d = (Data *)pQVar2;
        ppVar8[-1].first.d.ptr = pcVar3;
        ppVar8[-1].first.d.size = qVar4;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        ppVar8[-1].second.d.d = (Data *)pQVar5;
        ppVar8[-1].second.d.ptr = pcVar6;
        ppVar8[-1].second.d.size = qVar7;
        if (pQVar5 != (QArrayData *)0x0) {
          LOCK();
          (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        n = n + -1;
        ppVar8 = (this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
                 super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.ptr + -1;
        (this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
        super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.ptr = ppVar8;
        pqVar1 = &(this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
                  super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.size;
        *pqVar1 = *pqVar1 + 1;
      } while (n != 0);
    }
  }
  else {
    ppVar8 = (this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
             super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.ptr + i;
    memmove(ppVar8 + n,ppVar8,
            ((this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
             super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.size - i) * 0x30);
    lVar9 = n;
    if (n != 0) {
      do {
        (ppVar8->first).d.d = (Data *)pQVar2;
        (ppVar8->first).d.ptr = pcVar3;
        (ppVar8->first).d.size = qVar4;
        if (pQVar2 != (QArrayData *)0x0) {
          LOCK();
          (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        (ppVar8->second).d.d = (Data *)pQVar5;
        (ppVar8->second).d.ptr = pcVar6;
        (ppVar8->second).d.size = qVar7;
        if (pQVar5 != (QArrayData *)0x0) {
          LOCK();
          (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        lVar9 = lVar9 + -1;
        ppVar8 = ppVar8 + 1;
      } while (lVar9 != 0);
    }
    pqVar1 = &(this->super_QGenericArrayOps<std::pair<QByteArray,_QByteArray>_>).
              super_QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>.size;
    *pqVar1 = *pqVar1 + n;
  }
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,1,0x10);
    }
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,1,0x10);
      return;
    }
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }